

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O0

nng_err nuts_marry_ex(nng_socket s1,nng_socket s2,char *url,nng_pipe *p1,nng_pipe *p2)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  nng_err nVar6;
  nng_err nVar7;
  nng_time nVar8;
  char *pcVar9;
  nng_listener local_bc;
  int local_b8;
  nng_listener l2;
  int fd [2];
  int port;
  nng_listener l;
  char addr [64];
  nng_err rv;
  nng_time timeout;
  marriage_notice note;
  nng_pipe *p2_local;
  nng_pipe *p1_local;
  char *url_local;
  nng_socket s2_local;
  nng_socket s1_local;
  
  note._32_8_ = p2;
  p1_local = (nng_pipe *)url;
  if (url == (char *)0x0) {
    uVar1 = nng_random();
    uVar2 = nng_random();
    uVar3 = nng_random();
    uVar4 = nng_random();
    snprintf((char *)&port,0x40,"inproc://marry%04x%04x%04x%04x",(ulong)uVar1,(ulong)uVar2,
             (ulong)uVar3,uVar4);
    p1_local = (nng_pipe *)&port;
  }
  note.s1 = 0;
  note.s2 = 0;
  note.cv._0_4_ = nng_socket_id(s1);
  note.cv._4_4_ = nng_socket_id(s2);
  nVar8 = nng_clock();
  addr._60_4_ = nng_mtx_alloc((nng_mtx **)&timeout);
  if ((((addr._60_4_ == 0) &&
       (addr._60_4_ = nng_cv_alloc((nng_cv **)&note,(nng_mtx *)timeout), addr._60_4_ == 0)) &&
      (addr._60_4_ = nng_pipe_notify(s1,NNG_PIPE_EV_ADD_POST,married,&timeout),
      addr._60_4_ == NNG_OK)) &&
     (addr._60_4_ = nng_pipe_notify(s2,NNG_PIPE_EV_ADD_POST,married,&timeout), addr._60_4_ == NNG_OK
     )) {
    iVar5 = strcmp((char *)p1_local,"socket://");
    if (iVar5 == 0) {
      nVar6 = nng_socket_pair(&local_b8);
      if (nVar6 == NNG_OK) {
        addr._60_4_ = nng_listen(s1,(char *)p1_local,(nng_listener *)(fd + 1),0);
        if (((addr._60_4_ != 0) ||
            (addr._60_4_ = nng_listen(s2,(char *)p1_local,&local_bc,0), addr._60_4_ != 0)) ||
           ((addr._60_4_ = nng_listener_set_int((nng_listener)fd[1],"socket:fd",local_b8),
            addr._60_4_ != 0 ||
            (addr._60_4_ = nng_listener_set_int(local_bc,"socket:fd",l2.id), addr._60_4_ != 0)))) {
          close(local_b8);
          close(l2.id);
          nVar6._0_1_ = addr[0x3c];
          nVar6._1_1_ = addr[0x3d];
          nVar6._2_1_ = addr[0x3e];
          nVar6._3_1_ = addr[0x3f];
          return nVar6;
        }
      }
      else {
        if (nVar6 != NNG_ENOTSUP) {
          return nVar6;
        }
        p1_local = (nng_pipe *)anon_var_dwarf_2e27c;
      }
    }
    iVar5 = strcmp((char *)p1_local,"socket://");
    if ((iVar5 != 0) &&
       (nVar6 = nng_listen(s1,(char *)p1_local,(nng_listener *)(fd + 1),0), nVar6 != NNG_OK)) {
      return nVar6;
    }
    pcVar9 = strstr((char *)p1_local,":0");
    if (((pcVar9 != (char *)0x0) &&
        (iVar5 = nng_listener_get_int((nng_listener)fd[1],"tcp-bound-port",fd), iVar5 == 0)) &&
       (0 < fd[0])) {
      replace_port_zero((char *)p1_local,(char *)&port,fd[0]);
      p1_local = (nng_pipe *)&port;
    }
    addr._60_4_ = nng_socket_set_ms(s2,"reconnect-time-min",10);
    if (((addr._60_4_ == 0) &&
        (addr._60_4_ = nng_socket_set_ms(s2,"reconnect-time-max",10), addr._60_4_ == 0)) &&
       ((iVar5 = strcmp((char *)p1_local,"socket://"), iVar5 == 0 ||
        (addr._60_4_ = nng_dial(s2,(char *)p1_local,(nng_dialer *)0x0,0), addr._60_4_ == 0)))) {
      nng_mtx_lock((nng_mtx *)timeout);
      do {
        if (note.s1 != 0 && note.s2 != 0) break;
        addr._60_4_ = nng_cv_until((nng_cv *)note.mx,nVar8 + 1000);
      } while (addr._60_4_ == 0);
      nng_mtx_unlock((nng_mtx *)timeout);
      if (p1 != (nng_pipe *)0x0) {
        p1->id = note.cnt1;
      }
      if (note._32_8_ != 0) {
        *(int *)note._32_8_ = note.cnt2;
      }
    }
  }
  nng_pipe_notify(s1,NNG_PIPE_EV_ADD_POST,(nng_pipe_cb)0x0,(void *)0x0);
  nng_pipe_notify(s2,NNG_PIPE_EV_ADD_POST,(nng_pipe_cb)0x0,(void *)0x0);
  if (note.mx != (nng_mtx *)0x0) {
    nng_cv_free((nng_cv *)note.mx);
  }
  if (timeout != 0) {
    nng_mtx_free((nng_mtx *)timeout);
  }
  nVar7._0_1_ = addr[0x3c];
  nVar7._1_1_ = addr[0x3d];
  nVar7._2_1_ = addr[0x3e];
  nVar7._3_1_ = addr[0x3f];
  return nVar7;
}

Assistant:

nng_err
nuts_marry_ex(
    nng_socket s1, nng_socket s2, const char *url, nng_pipe *p1, nng_pipe *p2)
{
	struct marriage_notice note;
	nng_time               timeout;
	nng_err                rv;
	char                   addr[64];
	nng_listener           l;
	int                    port;
	int                    fd[2];

	if (url == NULL) {
		(void) snprintf(addr, sizeof(addr),
		    "inproc://marry%04x%04x%04x%04x", nng_random(),
		    nng_random(), nng_random(), nng_random());
		url = addr;
	}

	note.cnt1 = 0;
	note.cnt2 = 0;
	note.s1   = nng_socket_id(s1);
	note.s2   = nng_socket_id(s2);
	timeout   = nng_clock() + 1000; // 1 second

	if (((rv = nng_mtx_alloc(&note.mx)) != 0) ||
	    ((rv = nng_cv_alloc(&note.cv, note.mx)) != 0) ||
	    ((rv = nng_pipe_notify(
	          s1, NNG_PIPE_EV_ADD_POST, married, &note)) != 0) ||
	    ((rv = nng_pipe_notify(
	          s2, NNG_PIPE_EV_ADD_POST, married, &note)) != 0)) {
		goto done;
	}

	// If socket:// is requested we will try to use that, otherwise we
	// fake it with a TCP loopback socket.
	if (strcmp(url, "socket://") == 0) {
		rv = nng_socket_pair(fd);
		if (rv == 0) {
			nng_listener l2;
			if (((rv = nng_listen(s1, url, &l, 0)) != 0) ||
			    ((rv = nng_listen(s2, url, &l2, 0)) != 0) ||
			    ((rv = nng_listener_set_int(
			          l, NNG_OPT_SOCKET_FD, fd[0])) != 0) ||
			    ((rv = nng_listener_set_int(
			          l2, NNG_OPT_SOCKET_FD, fd[1])) != 0)) {
#ifdef _WIN32
				_close(fd[0]);
				_close(fd[1]);
#else
				close(fd[0]);
				close(fd[1]);
#endif
				return (rv);
			}
		} else if (rv == NNG_ENOTSUP) {
			url = "tcp://127.0.0.1:0";
			rv  = NNG_OK;
		} else {
			return (rv);
		}
	}

	if (strcmp(url, "socket://") != 0) {
		if ((rv = nng_listen(s1, url, &l, 0)) != 0) {
			return (rv);
		}
	}
	if ((strstr(url, ":0") != NULL) &&
	    // If a TCP port of zero was selected, let's ask for the actual
	    // port bound.
	    (nng_listener_get_int(l, NNG_OPT_TCP_BOUND_PORT, &port) == 0) &&
	    (port > 0)) {
		replace_port_zero(url, addr, port);
		url = addr;
	}
	if (((rv = nng_socket_set_ms(s2, NNG_OPT_RECONNMINT, 10)) != 0) ||
	    ((rv = nng_socket_set_ms(s2, NNG_OPT_RECONNMAXT, 10)) != 0)) {
		goto done;
	}
	if ((strcmp(url, "socket://") != 0) &&
	    ((rv = nng_dial(s2, url, NULL, 0)) != 0)) {
		goto done;
	}

	nng_mtx_lock(note.mx);
	while ((note.cnt1 == 0) || (note.cnt2 == 0)) {
		if ((rv = nng_cv_until(note.cv, timeout)) != 0) {
			break;
		}
	}
	nng_mtx_unlock(note.mx);
	if (p1 != NULL) {
		*p1 = note.p1;
	}
	if (p2 != NULL) {
		*p2 = note.p2;
	}

done:
	nng_pipe_notify(s1, NNG_PIPE_EV_ADD_POST, NULL, NULL);
	nng_pipe_notify(s2, NNG_PIPE_EV_ADD_POST, NULL, NULL);
	if (note.cv != NULL) {
		nng_cv_free(note.cv);
	}
	if (note.mx != NULL) {
		nng_mtx_free(note.mx);
	}
	return (rv);
}